

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_ack_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  quicly_sent_packet_t *pqVar2;
  long in_RSI;
  long *in_RDI;
  bool bVar3;
  st_quicly_application_space_t *space;
  int is_late_ack;
  uint64_t pn_sent;
  quicly_sent_packet_t *sent;
  uint64_t pn_block_max;
  size_t gap_index;
  uint64_t pn_acked;
  int ret;
  int includes_ack_eliciting;
  size_t bytes_acked;
  anon_struct_16_2_55a575c7 largest_newly_acked;
  quicly_sentmap_iter_t iter;
  quicly_ack_frame_t frame;
  undefined4 in_stack_ffffffffffffef28;
  int in_stack_ffffffffffffef2c;
  quicly_conn_t *in_stack_ffffffffffffef30;
  uint64_t in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef40;
  int in_stack_ffffffffffffef44;
  quicly_ack_frame_t *in_stack_ffffffffffffef48;
  long now;
  st_quicly_conn_t *in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef58;
  uint in_stack_ffffffffffffef5c;
  quicly_conn_t *conn_00;
  quicly_conn_t *now_00;
  quicly_loss_t *pqVar4;
  quicly_conn_t *local_1080;
  uint local_1074;
  ulong local_1070;
  undefined8 local_1040;
  quicly_conn_t *local_1038;
  quicly_loss_t *local_1028;
  long alStack_1020 [257];
  long alStack_818 [256];
  long local_18;
  long *local_10;
  int local_4;
  
  local_1070 = 0;
  local_1074 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = quicly_decode_ack_frame
                      ((uint8_t **)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),
                       (uint8_t *)in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,
                       in_stack_ffffffffffffef44);
  if (local_4 == 0) {
    local_1080 = local_1038;
    now = *(long *)(local_18 + 0x10);
    if (now != 1) {
      if (now == 2) {
        *(byte *)(local_10 + 0x5f) = *(byte *)(local_10 + 0x5f) & 0xfd;
      }
      init_acks_iter(in_stack_ffffffffffffef30,
                     (quicly_sentmap_iter_t *)
                     CONCAT44(in_stack_ffffffffffffef2c,in_stack_ffffffffffffef28));
      do {
        if (alStack_1020[(long)local_1028] == 0) {
          __assert_fail("frame.ack_block_lengths[gap_index] != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x129d,
                        "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                       );
        }
        now_00 = (quicly_conn_t *)
                 ((local_1080->super).local.cid_set.cids[0].cid.cid +
                 alStack_1020[(long)local_1028] + -0x31);
        pqVar4 = local_1028;
        while (pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1475ab),
              (quicly_conn_t *)pqVar2->packet_number < local_1080) {
          quicly_sentmap_skip((quicly_sentmap_iter_t *)0x1475c2);
        }
        do {
          pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1475d3);
          conn_00 = (quicly_conn_t *)pqVar2->packet_number;
          if (conn_00 < local_1080) {
            __assert_fail("pn_acked <= pn_sent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0x12a7,
                          "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                         );
          }
          if ((local_1080 < conn_00) && (local_1080 = conn_00, now_00 < conn_00)) {
            local_1080 = (quicly_conn_t *)((long)&(now_00->super).ctx + 1);
            break;
          }
          if (*(ulong *)(local_18 + 0x10) != (ulong)pqVar2->ack_epoch) {
            return 0x2000a;
          }
          in_stack_ffffffffffffef5c = 0;
          if ((pqVar2->field_0x11 & 1) != 0) {
            local_1074 = 1;
            bVar3 = pqVar2->cc_bytes_in_flight == 0;
            if (bVar3) {
              local_10[0x6e] = local_10[0x6e] + 1;
            }
            in_stack_ffffffffffffef5c = (uint)bVar3;
          }
          local_10[0x6d] = local_10[0x6d] + 1;
          QUICLY_TRACER_PACKET_ACKED
                    ((st_quicly_conn_t *)
                     CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                     in_stack_ffffffffffffef38,(uint64_t)in_stack_ffffffffffffef30,
                     in_stack_ffffffffffffef2c);
          if (pqVar2->cc_bytes_in_flight != 0) {
            local_1070 = pqVar2->cc_bytes_in_flight + local_1070;
          }
          iVar1 = quicly_sentmap_update
                            ((quicly_sentmap_t *)conn_00,
                             (quicly_sentmap_iter_t *)
                             CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),
                             (quicly_sentmap_event_t)((ulong)in_stack_ffffffffffffef50 >> 0x20));
          if (iVar1 != 0) {
            return iVar1;
          }
          if ((*(long *)(local_18 + 0x10) == 3) &&
             (in_stack_ffffffffffffef50 = (st_quicly_conn_t *)local_10[0xa8],
             *(quicly_conn_t **)&(in_stack_ffffffffffffef50->super).local.address <= local_1080)) {
            *(undefined8 *)&(in_stack_ffffffffffffef50->super).local.address = 0xffffffffffffffff;
            *(long *)((long)&(in_stack_ffffffffffffef50->super).local.address + 8) =
                 local_10[0xcb] + *(long *)(*local_10 + 0x88);
          }
          local_1080 = (quicly_conn_t *)((long)&(local_1080->super).ctx + 1);
        } while (local_1080 <= now_00);
        if (local_1080 != (quicly_conn_t *)((long)&(now_00->super).ctx + 1U)) {
          __assert_fail("pn_acked == pn_block_max + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x12cf,
                        "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                       );
        }
        local_1028 = (quicly_loss_t *)((long)&pqVar4[-1].sentmap._pending_packet + 7);
        if (pqVar4 == (quicly_loss_t *)0x0) {
          iVar1 = on_ack_stream_ack_cached
                            ((quicly_conn_t *)
                             CONCAT44(in_stack_ffffffffffffef2c,in_stack_ffffffffffffef28));
          if (iVar1 != 0) {
            return iVar1;
          }
          quicly_loss_on_ack_received
                    ((quicly_loss_t *)conn_00,
                     CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),
                     (size_t)in_stack_ffffffffffffef50,now,
                     CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                     in_stack_ffffffffffffef38,(int)now_00);
          if (local_1070 != 0) {
            local_1074 = (uint)*(ushort *)(local_10 + 0xcd);
            (**(code **)(local_10[0xe7] + 0x10))
                      (local_10 + 0xe7,local_10 + 0xb8,local_1070 & 0xffffffff,local_1040,
                       local_10[0xc9] + local_1070,local_10[0x138]);
            QUICLY_TRACER_QUICTRACE_CC_ACK
                      (in_stack_ffffffffffffef50,now,
                       (quicly_rtt_t *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40)
                       ,(uint32_t)(in_stack_ffffffffffffef38 >> 0x20),
                       (size_t)in_stack_ffffffffffffef30);
          }
          QUICLY_TRACER_CC_ACK_RECEIVED
                    (in_stack_ffffffffffffef50,now,
                     CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                     in_stack_ffffffffffffef38,(uint32_t)((ulong)in_stack_ffffffffffffef30 >> 0x20),
                     CONCAT44(in_stack_ffffffffffffef2c,local_1074));
          iVar1 = quicly_loss_detect_loss
                            (local_1028,(int64_t)now_00,(uint32_t)((ulong)pqVar2 >> 0x20),
                             (int)pqVar2,(quicly_loss_on_detect_cb)conn_00);
          if (iVar1 != 0) {
            return iVar1;
          }
          update_loss_alarm(conn_00,in_stack_ffffffffffffef5c);
          return 0;
        }
        local_1080 = (quicly_conn_t *)
                     ((local_1080->super).local.cid_set.cids[0].cid.cid +
                     alStack_818[(long)local_1028] + -0x30);
      } while( true );
    }
    local_4 = 0x2000a;
  }
  return local_4;
}

Assistant:

static int handle_ack_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_ack_frame_t frame;
    quicly_sentmap_iter_t iter;
    struct {
        uint64_t pn;
        int64_t sent_at;
    } largest_newly_acked = {UINT64_MAX, INT64_MAX};
    size_t bytes_acked = 0;
    int includes_ack_eliciting = 0, ret;

    if ((ret = quicly_decode_ack_frame(&state->src, state->end, &frame, state->frame_type == QUICLY_FRAME_TYPE_ACK_ECN)) != 0)
        return ret;

    uint64_t pn_acked = frame.smallest_acknowledged;

    switch (state->epoch) {
    case QUICLY_EPOCH_0RTT:
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    case QUICLY_EPOCH_HANDSHAKE:
        conn->super.remote.address_validation.send_probe = 0;
        break;
    default:
        break;
    }

    init_acks_iter(conn, &iter);

    /* TODO log PNs being ACKed too late */

    size_t gap_index = frame.num_gaps;
    while (1) {
        assert(frame.ack_block_lengths[gap_index] != 0);
        /* Ack blocks are organized in the ACK frame and consequently in the ack_block_lengths array from the largest acked down.
         * Processing acks in packet number order requires processing the ack blocks in reverse order. */
        uint64_t pn_block_max = pn_acked + frame.ack_block_lengths[gap_index] - 1;
        QUICLY_PROBE(ACK_BLOCK_RECEIVED, conn, conn->stash.now, pn_acked, pn_block_max);
        while (quicly_sentmap_get(&iter)->packet_number < pn_acked)
            quicly_sentmap_skip(&iter);
        do {
            const quicly_sent_packet_t *sent = quicly_sentmap_get(&iter);
            uint64_t pn_sent = sent->packet_number;
            assert(pn_acked <= pn_sent);
            if (pn_acked < pn_sent) {
                /* set pn_acked to pn_sent; or past the end of the ack block, for use with the next ack block */
                if (pn_sent <= pn_block_max) {
                    pn_acked = pn_sent;
                } else {
                    pn_acked = pn_block_max + 1;
                    break;
                }
            }
            /* process newly acked packet */
            if (state->epoch != sent->ack_epoch)
                return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            int is_late_ack = 0;
            if (sent->ack_eliciting) {
                includes_ack_eliciting = 1;
                if (sent->cc_bytes_in_flight == 0) {
                    is_late_ack = 1;
                    ++conn->super.stats.num_packets.late_acked;
                }
            }
            ++conn->super.stats.num_packets.ack_received;
            largest_newly_acked.pn = pn_acked;
            largest_newly_acked.sent_at = sent->sent_at;
            QUICLY_PROBE(PACKET_ACKED, conn, conn->stash.now, pn_acked, is_late_ack);
            if (sent->cc_bytes_in_flight != 0) {
                bytes_acked += sent->cc_bytes_in_flight;
            }
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_ACKED)) != 0)
                return ret;
            if (state->epoch == QUICLY_EPOCH_1RTT) {
                struct st_quicly_application_space_t *space = conn->application;
                if (space->cipher.egress.key_update_pn.last <= pn_acked) {
                    space->cipher.egress.key_update_pn.last = UINT64_MAX;
                    space->cipher.egress.key_update_pn.next = conn->egress.packet_number + conn->super.ctx->max_packets_per_key;
                    QUICLY_PROBE(CRYPTO_SEND_KEY_UPDATE_CONFIRMED, conn, conn->stash.now, space->cipher.egress.key_update_pn.next);
                }
            }
            ++pn_acked;
        } while (pn_acked <= pn_block_max);
        assert(pn_acked == pn_block_max + 1);
        if (gap_index-- == 0)
            break;
        pn_acked += frame.gaps[gap_index];
    }

    if ((ret = on_ack_stream_ack_cached(conn)) != 0)
        return ret;

    QUICLY_PROBE(ACK_DELAY_RECEIVED, conn, conn->stash.now, frame.ack_delay);

    /* Update loss detection engine on ack. The function uses ack_delay only when the largest_newly_acked is also the largest acked
     * so far. So, it does not matter if the ack_delay being passed in does not apply to the largest_newly_acked. */
    quicly_loss_on_ack_received(&conn->egress.loss, largest_newly_acked.pn, state->epoch, conn->stash.now,
                                largest_newly_acked.sent_at, frame.ack_delay, includes_ack_eliciting);

    /* OnPacketAcked and OnPacketAckedCC */
    if (bytes_acked > 0) {
        conn->egress.cc.type->cc_on_acked(&conn->egress.cc, &conn->egress.loss, (uint32_t)bytes_acked, frame.largest_acknowledged,
                                          (uint32_t)(conn->egress.loss.sentmap.bytes_in_flight + bytes_acked), conn->stash.now,
                                          conn->egress.max_udp_payload_size);
        QUICLY_PROBE(QUICTRACE_CC_ACK, conn, conn->stash.now, &conn->egress.loss.rtt, conn->egress.cc.cwnd,
                     conn->egress.loss.sentmap.bytes_in_flight);
    }

    QUICLY_PROBE(CC_ACK_RECEIVED, conn, conn->stash.now, frame.largest_acknowledged, bytes_acked, conn->egress.cc.cwnd,
                 conn->egress.loss.sentmap.bytes_in_flight);

    /* loss-detection  */
    if ((ret = quicly_loss_detect_loss(&conn->egress.loss, conn->stash.now, conn->super.remote.transport_params.max_ack_delay,
                                       conn->initial == NULL && conn->handshake == NULL, on_loss_detected)) != 0)
        return ret;
    update_loss_alarm(conn, 0);

    return 0;
}